

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O0

PyObject * libxml_xmlValidNormalizeAttributeValue(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *local_70;
  PyObject *local_68;
  undefined8 local_60;
  xmlChar *value;
  xmlChar *name;
  PyObject *pyobj_elem;
  xmlNodePtr elem;
  PyObject *pyobj_doc;
  xmlDocPtr doc;
  xmlChar *c_retval;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  py_retval = args;
  args_local = self;
  iVar1 = libxml_deprecationWarning("xmlValidNormalizeAttributeValue");
  if (iVar1 == -1) {
    self_local = (PyObject *)0x0;
  }
  else {
    iVar1 = _PyArg_ParseTuple_SizeT
                      (py_retval,"OOzz:xmlValidNormalizeAttributeValue",&elem,&name,&value,&local_60
                      );
    if (iVar1 == 0) {
      self_local = (PyObject *)0x0;
    }
    else {
      if (elem == (xmlNodePtr)&_Py_NoneStruct) {
        local_68 = (PyObject *)0x0;
      }
      else {
        local_68 = (PyObject *)elem->name;
      }
      pyobj_doc = local_68;
      if (name == &_Py_NoneStruct) {
        local_70 = (PyObject *)0x0;
      }
      else {
        local_70 = *(PyObject **)(name + 0x10);
      }
      pyobj_elem = local_70;
      doc = (xmlDocPtr)xmlValidNormalizeAttributeValue(local_68,local_70,value,local_60);
      self_local = libxml_xmlCharPtrWrap((xmlChar *)doc);
    }
  }
  return self_local;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_xmlValidNormalizeAttributeValue(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    xmlChar * c_retval;
    xmlDocPtr doc;
    PyObject *pyobj_doc;
    xmlNodePtr elem;
    PyObject *pyobj_elem;
    xmlChar * name;
    xmlChar * value;

    if (libxml_deprecationWarning("xmlValidNormalizeAttributeValue") == -1)
        return(NULL);

    if (!PyArg_ParseTuple(args, (char *)"OOzz:xmlValidNormalizeAttributeValue", &pyobj_doc, &pyobj_elem, &name, &value))
        return(NULL);
    doc = (xmlDocPtr) PyxmlNode_Get(pyobj_doc);
    elem = (xmlNodePtr) PyxmlNode_Get(pyobj_elem);

    c_retval = xmlValidNormalizeAttributeValue(doc, elem, name, value);
    py_retval = libxml_xmlCharPtrWrap((xmlChar *) c_retval);
    return(py_retval);
}